

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Node::AddP70bool(Node *this,string *name,bool value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Node n;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Node local_98;
  
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"P","");
  paVar1 = &local_98.name.field_2;
  local_98.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_d8,local_d0 + (long)local_d8);
  local_98.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.force_has_children = false;
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  pcVar2 = (name->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + name->_M_string_length);
  AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,int>
            (&local_98,&local_b8,"bool","","",(uint)value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,&local_98);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_98.children);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector(&local_98.properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.name._M_dataplus._M_p,local_98.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FBX::Node::AddP70bool(
    const std::string& name, bool value
) {
    FBX::Node n("P");
    n.AddProperties(name, "bool", "", "", int32_t(value));
    AddChild(n);
}